

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits.cpp
# Opt level: O1

int32_t __thiscall
VersionBitsCache::ComputeBlockVersion(VersionBitsCache *this,CBlockIndex *pindexPrev,Params *params)

{
  ThresholdState TVar1;
  uint uVar2;
  int i;
  long lVar3;
  BIP9Deployment *pBVar4;
  ThresholdConditionCache *cache;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  AbstractThresholdConditionChecker local_58;
  undefined2 local_50;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_owns = false;
  local_48._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_48);
  cache = this->m_caches;
  pBVar4 = params->vDeployments;
  uVar2 = 0x20000000;
  lVar3 = 0;
  do {
    local_58._vptr_AbstractThresholdConditionChecker = (_func_int **)&PTR_Condition_013b7508;
    local_50 = (undefined2)lVar3;
    TVar1 = AbstractThresholdConditionChecker::GetStateFor(&local_58,pindexPrev,params,cache);
    if (TVar1 - STARTED < 2) {
      uVar2 = uVar2 | 1 << ((byte)pBVar4->bit & 0x1f);
    }
    lVar3 = lVar3 + 1;
    cache = cache + 1;
    pBVar4 = pBVar4 + 1;
  } while (lVar3 == 1);
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

int32_t VersionBitsCache::ComputeBlockVersion(const CBlockIndex* pindexPrev, const Consensus::Params& params)
{
    LOCK(m_mutex);
    int32_t nVersion = VERSIONBITS_TOP_BITS;

    for (int i = 0; i < (int)Consensus::MAX_VERSION_BITS_DEPLOYMENTS; i++) {
        Consensus::DeploymentPos pos = static_cast<Consensus::DeploymentPos>(i);
        ThresholdState state = VersionBitsConditionChecker(pos).GetStateFor(pindexPrev, params, m_caches[pos]);
        if (state == ThresholdState::LOCKED_IN || state == ThresholdState::STARTED) {
            nVersion |= Mask(params, pos);
        }
    }

    return nVersion;
}